

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.cpp
# Opt level: O0

void printDifference<float>
               (Serializer *serializer1,Serializer *serializer2,Savepoint *savepoint,
               DataFieldInfo *info1,DataFieldInfo *info2,IJKLBounds *bounds,
               vector<bool,_std::allocator<bool>_> *failed)

{
  const_reference cVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  _Setprecision _Var4;
  double *pdVar5;
  ostream *poVar6;
  void *this;
  double local_b0;
  double local_a8;
  double local_a0;
  double ref;
  double val;
  float local_88;
  int index;
  int l;
  int k;
  int j;
  int i;
  double maxAbsError;
  double maxRelError;
  int local_60;
  uint nNan;
  int nErrors;
  int nValues;
  int lSize;
  int kSize;
  int jSize;
  int iSize;
  float *data2;
  float *data1;
  IJKLBounds *bounds_local;
  DataFieldInfo *info2_local;
  DataFieldInfo *info1_local;
  Savepoint *savepoint_local;
  Serializer *serializer2_local;
  Serializer *serializer1_local;
  
  data1 = (float *)bounds;
  bounds_local = (IJKLBounds *)info2;
  info2_local = info1;
  info1_local = (DataFieldInfo *)savepoint;
  savepoint_local = (Savepoint *)serializer2;
  serializer2_local = serializer1;
  readData<float>(serializer1,info1,savepoint,&data2);
  readData<float>((Serializer *)savepoint_local,(DataFieldInfo *)bounds_local,
                  (Savepoint *)info1_local,(float **)&jSize);
  kSize = ser::DataFieldInfo::iSize(info2_local);
  lSize = ser::DataFieldInfo::jSize(info2_local);
  nValues = ser::DataFieldInfo::kSize(info2_local);
  nErrors = ser::DataFieldInfo::lSize(info2_local);
  nNan = (((int)data1[1] - (int)*data1) + 1) * (((int)data1[3] - (int)data1[2]) + 1) *
         (((int)data1[5] - (int)data1[4]) + 1) * (((int)data1[7] - (int)data1[6]) + 1);
  local_60 = 0;
  maxRelError._4_4_ = 0;
  maxAbsError = 0.0;
  _j = 0.0;
  for (k = (int)*data1; k <= (int)data1[1]; k = k + 1) {
    for (l = (int)data1[2]; l <= (int)data1[3]; l = l + 1) {
      for (index = (int)data1[4]; index <= (int)data1[5]; index = index + 1) {
        for (local_88 = data1[6]; (int)local_88 <= (int)data1[7];
            local_88 = (float)((int)local_88 + 1)) {
          val._4_4_ = k * lSize * nValues * nErrors + l * nValues * nErrors + index * nErrors +
                      (int)local_88;
          cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](failed,(long)val._4_4_);
          if (cVar1) {
            local_60 = local_60 + 1;
            ref = (double)data2[val._4_4_];
            local_a0 = (double)_jSize[val._4_4_];
            if ((NAN(ref)) || (NAN(local_a0))) {
              maxRelError._4_4_ = maxRelError._4_4_ + 1;
            }
            local_a8 = ABS(ref - local_a0);
            pdVar5 = std::max<double>((double *)&j,&local_a8);
            _j = *pdVar5;
            local_b0 = ABS((ref - local_a0) / local_a0);
            pdVar5 = std::max<double>(&maxAbsError,&local_b0);
            maxAbsError = *pdVar5;
          }
        }
      }
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout," | Number of values: ");
  _Var3 = std::setw(6);
  poVar6 = std::operator<<(poVar6,_Var3);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,nNan);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&std::cout," | Number of errors: ");
  _Var3 = std::setw(6);
  poVar6 = std::operator<<(poVar6,_Var3);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_60);
  std::operator<<(poVar6,"\n");
  if (maxRelError._4_4_ != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout," | Number of NaN errors: ");
    _Var3 = std::setw(6);
    poVar6 = std::operator<<(poVar6,_Var3);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,maxRelError._4_4_);
    std::operator<<(poVar6,"\n");
  }
  poVar6 = std::operator<<((ostream *)&std::cout," | Percentuage of errors: ");
  _Var4 = std::setprecision(2);
  poVar6 = std::operator<<(poVar6,_Var4);
  this = (void *)std::ostream::operator<<(poVar6,std::fixed);
  poVar6 = (ostream *)std::ostream::operator<<(this,((double)local_60 * 100.0) / (double)(int)nNan);
  std::operator<<(poVar6," %\n");
  poVar6 = std::operator<<((ostream *)&std::cout," | Maximum absolute error: ");
  _Var3 = std::setw(0x11);
  poVar6 = std::operator<<(poVar6,_Var3);
  _Var2 = std::setfill<char>(' ');
  poVar6 = std::operator<<(poVar6,_Var2._M_c);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::scientific);
  _Var4 = std::setprecision(10);
  poVar6 = std::operator<<(poVar6,_Var4);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,_j);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&std::cout," | Maximum relative error: ");
  _Var3 = std::setw(0x11);
  poVar6 = std::operator<<(poVar6,_Var3);
  _Var2 = std::setfill<char>(' ');
  poVar6 = std::operator<<(poVar6,_Var2._M_c);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::scientific);
  _Var4 = std::setprecision(10);
  poVar6 = std::operator<<(poVar6,_Var4);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,maxAbsError);
  std::operator<<(poVar6,"\n");
  if (data2 != (float *)0x0) {
    operator_delete__(data2);
  }
  if (_jSize != (float *)0x0) {
    operator_delete__(_jSize);
  }
  return;
}

Assistant:

void printDifference(const Serializer& serializer1, const Serializer& serializer2,
                     const Savepoint& savepoint,
                     const DataFieldInfo& info1, const DataFieldInfo& info2,
                     const IJKLBounds& bounds,
                     const vector<bool>& failed)
{
    T* data1;
    readData(serializer1, info1, savepoint, data1);

    T* data2;
    readData(serializer2, info2, savepoint, data2);

    int iSize = info1.iSize();
    int jSize = info1.jSize();
    int kSize = info1.kSize();
    int lSize = info1.lSize();

    int nValues = (bounds.iUpper - bounds.iLower + 1) * (bounds.jUpper - bounds.jLower + 1) *
                  (bounds.kUpper - bounds.kLower + 1) * (bounds.lUpper - bounds.lLower + 1);
    int nErrors = 0;
    unsigned int nNan = 0;

    double maxRelError = 0;
    double maxAbsError = 0;

    for (int i = bounds.iLower; i <= bounds.iUpper; ++i) {
        for (int j = bounds.jLower; j <= bounds.jUpper; ++j) {
            for (int k = bounds.kLower; k <= bounds.kUpper; ++k) {
                for (int l = bounds.lLower; l <= bounds.lUpper; ++l) {
                    int index = i * jSize * kSize * lSize + j * kSize * lSize + k * lSize + l;
                    if (failed[index]) {
                        ++nErrors;

                        const double val = static_cast<double>(data1[index]);
                        const double ref = static_cast<double>(data2[index]);

                        if ((val != val) || (ref != ref)) {
                            ++nNan;
                        }
                        maxAbsError = std::max(maxAbsError, std::fabs(val - ref));
                        maxRelError = std::max(maxRelError, std::fabs((val - ref) / ref));
                    }
                }
            }
        }
    }

    std::cout << " | Number of values: " << std::setw(6) << nValues << "\n";
    std::cout << " | Number of errors: " << std::setw(6) << nErrors << "\n";
    if (nNan > 0) std::cout << " | Number of NaN errors: " << std::setw(6) << nNan << "\n";
    std::cout << " | Percentuage of errors: " << std::setprecision(2) << std::fixed << (100.*nErrors) / nValues << " %\n";
    std::cout << " | Maximum absolute error: " << std::setw(17) << std::setfill(' ') << std::scientific << std::setprecision(10) << maxAbsError  << "\n";
    std::cout << " | Maximum relative error: " << std::setw(17) << std::setfill(' ') << std::scientific << std::setprecision(10) << maxRelError  << "\n";

    delete [] data1;
    delete [] data2;

}